

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::PropertyExprSyntax*>
          (BumpAllocator *this,TimingControlSyntax *args,PropertyExprSyntax **args_1)

{
  PropertyExprSyntax *pPVar1;
  ClockingPropertyExprSyntax *pCVar2;
  
  pCVar2 = (ClockingPropertyExprSyntax *)allocate(this,0x28,8);
  pPVar1 = *args_1;
  (pCVar2->super_PropertyExprSyntax).super_SyntaxNode.kind = ClockingPropertyExpr;
  (pCVar2->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar2->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar2->event).ptr = args;
  pCVar2->expr = pPVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pCVar2;
  if (pPVar1 != (PropertyExprSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)pCVar2;
  }
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }